

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlParseJson.c
# Opt level: O0

JL_STATUS ParseOutNumberString
                    (char *String,size_t StringLength,_Bool AllowJson5,size_t *pAmountProcessed,
                    char **pProcessedString)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  char *__dest;
  char *local_80;
  char *stringPtr;
  size_t i_1;
  _Bool hadE;
  _Bool hadPoint;
  _Bool pointAllowed;
  _Bool eAllowed;
  _Bool plusAllowed;
  ulong uStack_68;
  _Bool minusAllowed;
  size_t i;
  _Bool isSpecial;
  _Bool hexMode;
  char *processedString;
  size_t numSkippedChars;
  size_t strEndPos;
  size_t strLength;
  JL_STATUS jlStatus;
  char **pProcessedString_local;
  size_t *pAmountProcessed_local;
  _Bool AllowJson5_local;
  size_t StringLength_local;
  char *String_local;
  
  strEndPos = 0;
  numSkippedChars = 0;
  processedString = (char *)0x0;
  bVar5 = false;
  bVar1 = false;
  strLength._4_4_ = JL_STATUS_SUCCESS;
  if (AllowJson5) {
    if (StringLength < 4) {
      if ((2 < StringLength) &&
         ((iVar6 = strncasecmp(String,"inf",3), iVar6 == 0 ||
          (iVar6 = strncasecmp(String,"nan",3), iVar6 == 0)))) {
        strEndPos = 3;
        bVar1 = true;
      }
    }
    else {
      iVar6 = strncasecmp(String,"+inf",4);
      if ((iVar6 == 0) || (iVar6 = strncasecmp(String,"-inf",4), iVar6 == 0)) {
        strEndPos = 4;
        bVar1 = true;
      }
    }
  }
  if (!bVar1) {
    strLength._4_4_ = JL_STATUS_SUCCESS;
    for (uStack_68 = 0; uStack_68 < StringLength; uStack_68 = uStack_68 + 1) {
      if ((((((String[uStack_68] < '0') || ('9' < String[uStack_68])) && (String[uStack_68] != '-'))
           && ((String[uStack_68] != '.' && (String[uStack_68] != 'E')))) &&
          (String[uStack_68] != 'e')) && (String[uStack_68] != '+')) {
        if (((((((String[uStack_68] == ' ') || (String[uStack_68] == '\r')) ||
               ((String[uStack_68] == '\n' || (String[uStack_68] == '\t')))) ||
              ((String[uStack_68] == '\v' && (AllowJson5)))) ||
             ((String[uStack_68] == '\f' && (AllowJson5)))) ||
            ((((((String[uStack_68] == ',' || (String[uStack_68] == '}')) ||
                (String[uStack_68] == ']')) ||
               (((AllowJson5 && (String[uStack_68] == -0x3e)) && (String[uStack_68 + 1] == -0x60))))
              || (((AllowJson5 && (String[uStack_68] == -0x1e)) &&
                  ((String[uStack_68 + 1] == -0x80 && (String[uStack_68 + 2] == -0x58)))))) ||
             ((((AllowJson5 && (String[uStack_68] == -0x1e)) && (String[uStack_68 + 1] == -0x80)) &&
              (String[uStack_68 + 2] == -0x57)))))) ||
           ((((AllowJson5 && (String[uStack_68] == -0x11)) &&
             ((String[uStack_68 + 1] == -0x45 && (String[uStack_68 + 2] == -0x41)))) ||
            ((AllowJson5 && (String[uStack_68] == '/')))))) break;
        if ((AllowJson5) &&
           (((uStack_68 == 1 && (*String == '0')) && ((String[1] == 'x' || (String[1] == 'X')))))) {
          bVar5 = true;
        }
        else if ((!bVar5) ||
                (((String[uStack_68] < 'a' || ('f' < String[uStack_68])) &&
                 ((String[uStack_68] < 'A' || ('F' < String[uStack_68])))))) {
          strLength._4_4_ = JL_STATUS_INVALID_DATA;
          break;
        }
      }
      numSkippedChars = uStack_68;
    }
  }
  if ((bVar5) && (numSkippedChars == 1)) {
    strLength._4_4_ = JL_STATUS_INVALID_DATA;
  }
  else if ((bVar5) && (0x11 < numSkippedChars)) {
    strLength._4_4_ = JL_STATUS_INVALID_DATA;
  }
  if (((strLength._4_4_ == JL_STATUS_SUCCESS) && (!AllowJson5)) && (String[numSkippedChars] == '.'))
  {
    strLength._4_4_ = JL_STATUS_INVALID_DATA;
  }
  if ((strLength._4_4_ == JL_STATUS_SUCCESS) && (!bVar1)) {
    bVar1 = true;
    bVar2 = false;
    bVar3 = false;
    bVar4 = false;
    strEndPos = numSkippedChars + 1;
    strLength._4_4_ = JL_STATUS_SUCCESS;
    i_1._4_1_ = AllowJson5;
    i_1._6_1_ = AllowJson5;
    for (stringPtr = (char *)0x0; stringPtr < strEndPos; stringPtr = stringPtr + 1) {
      if (bVar5) {
        if (((((char *)0x1 < stringPtr) &&
             ((String[(long)stringPtr] < '0' || ('9' < String[(long)stringPtr])))) &&
            ((String[(long)stringPtr] < 'a' || ('f' < String[(long)stringPtr])))) &&
           ((String[(long)stringPtr] < 'A' || ('F' < String[(long)stringPtr])))) {
          strLength._4_4_ = JL_STATUS_INVALID_DATA;
          break;
        }
      }
      else {
        if ((((String[(long)stringPtr] < '0') || ('9' < String[(long)stringPtr])) &&
            ((String[(long)stringPtr] != '-' || (!bVar1)))) &&
           ((((String[(long)stringPtr] != '.' || (i_1._4_1_ == '\0')) &&
             ((String[(long)stringPtr] != 'E' || (!bVar2)))) &&
            (((String[(long)stringPtr] != 'e' || (!bVar2)) &&
             ((String[(long)stringPtr] != '+' || (i_1._6_1_ == '\0')))))))) {
          strLength._4_4_ = JL_STATUS_INVALID_DATA;
          break;
        }
        if ((!bVar3) && (!bVar4)) {
          i_1._4_1_ = '\x01';
        }
        if (!bVar4) {
          bVar2 = true;
        }
        if ((String[(long)stringPtr] == 'e') || (String[(long)stringPtr] == 'E')) {
          bVar1 = true;
          i_1._6_1_ = '\x01';
          i_1._4_1_ = '\0';
          bVar2 = false;
          bVar4 = true;
        }
        else if (String[(long)stringPtr] == '.') {
          bVar3 = true;
          i_1._4_1_ = '\0';
          bVar2 = false;
        }
        else {
          bVar1 = false;
          i_1._6_1_ = '\0';
        }
      }
    }
  }
  if (strLength._4_4_ == JL_STATUS_SUCCESS) {
    local_80 = String;
    if ((AllowJson5) && (*String == '+')) {
      local_80 = String + 1;
      strEndPos = strEndPos - 1;
      processedString = (char *)0x1;
    }
    __dest = (char *)WjTestLib_Calloc(strEndPos + 1,1);
    if (__dest == (char *)0x0) {
      strLength._4_4_ = JL_STATUS_OUT_OF_MEMORY;
    }
    else {
      memcpy(__dest,local_80,strEndPos);
      *pProcessedString = __dest;
      *pAmountProcessed = (size_t)(processedString + strEndPos);
      strLength._4_4_ = JL_STATUS_SUCCESS;
    }
  }
  return strLength._4_4_;
}

Assistant:

static
JL_STATUS
    ParseOutNumberString
    (
        char const*         String,
        size_t              StringLength,
        bool                AllowJson5,
        size_t*             pAmountProcessed,
        char**              pProcessedString
    )
{
    JL_STATUS jlStatus;
    size_t strLength = 0;
    size_t strEndPos = 0;
    size_t numSkippedChars = 0;
    char* processedString = NULL;
    bool hexMode = false;
    bool isSpecial = false;

    jlStatus = JL_STATUS_SUCCESS;

    if( AllowJson5 )
    {
        // Check if inf or nan
        if( StringLength >= 4 )
        {
            if(     strncasecmp( String, "+inf", 4 ) == 0
                ||  strncasecmp( String, "-inf", 4 ) == 0 )
            {
                strLength = 4;
                isSpecial = true;
            }
        }
        else if( StringLength >= 3 )
        {
            if(     strncasecmp( String, "inf", 3 ) == 0
                ||  strncasecmp( String, "nan", 3 ) == 0 )
            {
                strLength = 3;
                isSpecial = true;
            }
        }
    }

    // Find end of number
    if( !isSpecial )
    {
        jlStatus = JL_STATUS_SUCCESS;
        for( size_t i=0; i<StringLength; i++ )
        {
            if(     ( String[i] >= '0' && String[i] <= '9' )
                ||  '-' == String[i]
                ||  '.' == String[i]
                ||  'E' == String[i]
                ||  'e' == String[i]
                ||  '+' == String[i] )
            {
                strEndPos = i;
            }
            else if(    ' ' == String[i]
                     || '\r' == String[i]
                     || '\n' == String[i]
                     || '\t' == String[i]
                     || ( '\v' == String[i] && AllowJson5 )
                     || ( '\f' == String[i] && AllowJson5 )
                     || ',' == String[i]
                     || '}' == String[i]
                     || ']' == String[i]
                     || ( AllowJson5 && '\xc2' == String[i] && '\xa0' == String[i+1] )
                     || ( AllowJson5 && '\xe2' == String[i] && '\x80' == String[i+1] && '\xa8' == String[i+2] )
                     || ( AllowJson5 && '\xe2' == String[i] && '\x80' == String[i+1] && '\xa9' == String[i+2] )
                     || ( AllowJson5 && '\xef' == String[i] && '\xbb' == String[i+1] && '\xbf' == String[i+2] ) )
            {
                // Valid character that can follow a number element.
                break;
            }
            else if(    AllowJson5
                     && '/' == String[i] )
            {
                // Start of comment
                break;
            }
            else if(    AllowJson5
                     && 1 == i
                     && '0' == String[0]
                     && ( 'x' == String[1] || 'X' == String[1] ) )
            {
                hexMode = true;
                strEndPos = i;
            }
            else if(    hexMode
                     && (   ( String[i] >= 'a' && String[i] <= 'f' )
                         || ( String[i] >= 'A' && String[i] <= 'F' ) ) )
            {
                strEndPos = i;
            }
            else
            {
                // Invalid character
                jlStatus = JL_STATUS_INVALID_DATA;
                break;
            }
        }
    }

    if( hexMode && 1 == strEndPos )
    {
        // Its an invalid string to only be 0x with nothing following.
        jlStatus = JL_STATUS_INVALID_DATA;
    }
    else if( hexMode && strEndPos > 17 )
    {
        // Its too long for a 64 bit hex number which is the largest that can be handled.
        jlStatus = JL_STATUS_INVALID_DATA;
    }

    if( JL_STATUS_SUCCESS == jlStatus && !AllowJson5 )
    {
        // Don't allow trailing decimal point (unless Json5)
        if( '.' == String[strEndPos] )
        {
            jlStatus = JL_STATUS_INVALID_DATA;
        }
    }

    if( JL_STATUS_SUCCESS == jlStatus && !isSpecial )
    {
        // Now verify that it is a valid number
        bool minusAllowed = true;
        bool plusAllowed = AllowJson5 ? true : false;      // Json5 allows a leading point
        bool eAllowed = false;
        bool pointAllowed = AllowJson5 ? true : false;      // Json5 allows a leading point

        bool hadPoint = false;
        bool hadE = false;

        strLength = strEndPos + 1;
        jlStatus = JL_STATUS_SUCCESS;

        for( size_t i=0; i<strLength; i++ )
        {
            if( hexMode )
            {
                if(     i < 2
                    ||  ( String[i] >= '0' && String[i] <= '9' )
                    ||  ( String[i] >= 'a' && String[i] <= 'f' )
                    ||  ( String[i] >= 'A' && String[i] <= 'F' ) )
                {
                    strEndPos = i;
                }
                else
                {
                    jlStatus = JL_STATUS_INVALID_DATA;
                    break;
                }
            }
            else if(    ( String[i] >= '0' && String[i] <= '9' )
                    ||  ( '-' == String[i] && minusAllowed )
                    ||  ( '.' == String[i] && pointAllowed )
                    ||  ( 'E' == String[i] && eAllowed )
                    ||  ( 'e' == String[i] && eAllowed )
                    ||  ( '+' == String[i] && plusAllowed ) )
            {
                strEndPos = i;

                if( !hadPoint && !hadE )
                {
                    pointAllowed = true;
                }
                if( !hadE )
                {
                    eAllowed = true;
                }

                if( 'e' == String[i] || 'E' == String[i] )
                {
                    minusAllowed = true;
                    plusAllowed = true;
                    pointAllowed = false;
                    eAllowed = false;
                    hadE = true;
                }
                else if( '.' == String[i] )
                {
                    hadPoint = true;
                    pointAllowed = false;
                    eAllowed = false;       // can't have E straight after decimal point
                }
                else
                {
                    minusAllowed = false;
                    plusAllowed = false;
                }
            }
            else
            {
                jlStatus = JL_STATUS_INVALID_DATA;
                break;
            }
        }
    }

    if( JL_STATUS_SUCCESS == jlStatus )
    {
        char const* stringPtr = String;

        if( AllowJson5 && '+' == stringPtr[0] )
        {
            // Skip leading '+' allowed by Json5
            stringPtr += 1;
            strLength -= 1;
            numSkippedChars += 1;
        }

        // Copy out number string into newly allocated string buffer
        processedString = JlAlloc( strLength + 1 );
        if( NULL != processedString )
        {
            memcpy( processedString, stringPtr, strLength );
            *pProcessedString = processedString;
            *pAmountProcessed = strLength + numSkippedChars;
            jlStatus = JL_STATUS_SUCCESS;
        }
        else
        {
            jlStatus = JL_STATUS_OUT_OF_MEMORY;
        }
    }

    return jlStatus;
}